

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O0

void Kit_PlaToIsop(char *pSop,Vec_Int_t *vCover)

{
  int iVar1;
  uint local_2c;
  int Entry;
  int nVars;
  int k;
  char *pCube;
  Vec_Int_t *vCover_local;
  char *pSop_local;
  
  iVar1 = Kit_PlaGetVarNum(pSop);
  if (iVar1 < 1) {
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,0x11f,"void Kit_PlaToIsop(char *, Vec_Int_t *)");
  }
  Vec_IntClear(vCover);
  _nVars = pSop;
  do {
    if (*_nVars == '\0') {
      return;
    }
    local_2c = 0;
    Entry = iVar1;
    while (Entry = Entry + -1, -1 < Entry) {
      if (_nVars[Entry] == '0') {
        local_2c = local_2c << 2 | 1;
      }
      else if (_nVars[Entry] == '1') {
        local_2c = local_2c << 2 | 2;
      }
      else {
        if (_nVars[Entry] != '-') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                        ,0x12d,"void Kit_PlaToIsop(char *, Vec_Int_t *)");
        }
        local_2c = local_2c << 2;
      }
    }
    Vec_IntPush(vCover,local_2c);
    _nVars = _nVars + (iVar1 + 3);
  } while( true );
}

Assistant:

void Kit_PlaToIsop( char * pSop, Vec_Int_t * vCover )
{
    char * pCube;
    int k, nVars, Entry;
    nVars = Kit_PlaGetVarNum( pSop );
    assert( nVars > 0 );
    // create cubes
    Vec_IntClear( vCover );
    for ( pCube = pSop; *pCube; pCube += nVars + 3 )
    {
        Entry = 0;
        for ( k = nVars - 1; k >= 0; k-- )
            if ( pCube[k] == '0' )
                Entry = (Entry << 2) | 1;
            else if ( pCube[k] == '1' )
                Entry = (Entry << 2) | 2;
            else if ( pCube[k] == '-' )
                Entry = (Entry << 2);
            else 
                assert( 0 );
        Vec_IntPush( vCover, Entry );
    }
}